

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmap.h
# Opt level: O3

void __thiscall allocmap::markused(allocmap *this,uint32_t ofs,uint32_t size,char *tag)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> _Var5;
  iterator __position;
  undefined8 *puVar6;
  uint uVar7;
  _Rb_tree_color _Var8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar9;
  pair<const_unsigned_int,_unsigned_int> local_38;
  
  if (size != 0) {
    p_Var1 = &(this->_m)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->_m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __position._M_node = &p_Var1->_M_header;
    for (; p_Var3 != (_Rb_tree_node_base *)0x0;
        p_Var3 = (&p_Var3->_M_left)[p_Var3[1]._M_color <= ofs]) {
      if (ofs < p_Var3[1]._M_color) {
        __position._M_node = p_Var3;
      }
    }
    if (__position._M_node == (this->_m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      local_38.first = ofs;
      local_38.second = size;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)this,&local_38);
    }
    else {
      _Var2 = size + ofs;
      _Var5._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
      iVar4 = *(int *)&_Var5._M_node[1].field_0x4;
      uVar7 = iVar4 + _Var5._M_node[1]._M_color;
      if (uVar7 == ofs) {
        if ((_Rb_tree_header *)__position._M_node != p_Var1) {
          _Var8 = __position._M_node[1]._M_color;
          if (_Var8 < _Var2) {
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs,(ulong)_Var2,
                   (ulong)_Var5._M_node[1]._M_color,(ulong)ofs,(ulong)_Var8,
                   *(int *)&__position._M_node[1].field_0x4 + _Var8);
            iVar4 = *(int *)&_Var5._M_node[1].field_0x4;
          }
        }
        *(uint32_t *)&_Var5._M_node[1].field_0x4 = iVar4 + size;
      }
      else if (ofs < uVar7) {
        printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs,(ulong)_Var2);
      }
      else {
        if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
           (__position._M_node[1]._M_color < _Var2)) {
          printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs,(ulong)_Var2);
        }
        local_38.first = ofs;
        local_38.second = size;
        pVar9 = std::
                _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                          ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                            *)this,&local_38);
        _Var5 = pVar9.first._M_node;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "failed to free";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        }
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
      }
      if ((_Rb_tree_header *)__position._M_node != p_Var1) {
        _Var8 = *(int *)&_Var5._M_node[1].field_0x4 + _Var5._M_node[1]._M_color;
        if (_Var8 == __position._M_node[1]._M_color) {
          *(int *)&_Var5._M_node[1].field_0x4 =
               *(int *)&_Var5._M_node[1].field_0x4 + *(int *)&__position._M_node[1].field_0x4;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)this,__position);
        }
        else if (__position._M_node[1]._M_color < _Var8) {
          printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs,(ulong)_Var2);
        }
      }
    }
  }
  return;
}

Assistant:

void markused(uint32_t ofs, uint32_t size, const char *tag)
    {
//        printf("mark %08x-%08x (%8x): %s\n", ofs, ofs+size, size, tag);
        if (size==0)
            return;
        uint32_t end= ofs+size;
        //printf("used(%08x-%08x) %s\n", ofs, end, tag);

        auto i= _m.upper_bound(ofs);
        if (i==_m.begin()) {
            // first item
            _m.insert(allocmap_t::value_type(ofs, size));
            return;
        }
        auto next= i;
        --i;
        // now  i->first <= ofs  < (i+1)->first

        if (endofs(i)==ofs) {
            //  --------<.......>----------<....>
            //          i      ie
            //                 ofs...end
            if (next!=_m.end() && end > next->first)
                printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
                //throw "overlap";
            i->second += size;
        }
        else if (endofs(i) > ofs) {
            //  --------<.......>----------<....>
            //          i      ie
            //               ofs...end
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
            //throw "overlap";
        }
        else {
            //  --------<.......>----------<....>
            //          i      ie
            //                    ofs...end
            if (next!=_m.end() && end > next->first) {
                //  --------<.......>----------<......>
                //          i      ie
                //                    ofs........end
                
                printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
                //throw "overlap";
            }
            auto ins= _m.insert(allocmap_t::value_type(ofs, size));
            if (!ins.second)
                throw "failed to free";
            i= ins.first;

            next= i; ++next;
        }

        if (next==_m.end())
            return;

        // now check if we need to merge with 'next'
        if (endofs(i) == next->first) {
            i->second += next->second;
            _m.erase(next);
        }
        else if (endofs(i) > next->first) {
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
            //throw "overlap";
        }
    }